

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst
          (GraphicsRobustAccessPass *this,TypeManager *tm,Instruction *x,Instruction *min,
          Instruction *max,Instruction *where)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t uVar1;
  int iVar2;
  uint32_t type_id;
  Type *pTVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Instruction *pIVar4;
  Operand *local_2d8;
  allocator<spvtools::opt::Operand> local_2ad;
  uint32_t local_2ac;
  iterator local_2a8;
  undefined8 local_2a0;
  SmallVector<unsigned_int,_2UL> local_298;
  uint32_t local_26c;
  iterator local_268;
  undefined8 local_260;
  SmallVector<unsigned_int,_2UL> local_258;
  uint32_t local_22c;
  iterator local_228;
  undefined8 local_220;
  SmallVector<unsigned_int,_2UL> local_218;
  uint local_1ec;
  iterator local_1e8;
  undefined8 local_1e0;
  SmallVector<unsigned_int,_2UL> local_1d8;
  uint32_t local_1ac;
  iterator local_1a8;
  undefined8 local_1a0;
  SmallVector<unsigned_int,_2UL> local_198;
  Operand local_170;
  Operand OStack_140;
  Operand OStack_110;
  Operand OStack_e0;
  Operand OStack_b0;
  iterator local_80;
  _func_int **local_78;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_70;
  Instruction *clamp_inst;
  uint32_t local_48;
  uint32_t maxwidth;
  uint32_t minwidth;
  uint32_t xwidth;
  uint32_t clamp_id;
  uint32_t glsl_insts_id;
  Instruction *where_local;
  Instruction *max_local;
  Instruction *min_local;
  Instruction *x_local;
  TypeManager *tm_local;
  GraphicsRobustAccessPass *this_local;
  
  _clamp_id = where;
  where_local = max;
  max_local = min;
  min_local = x;
  x_local = (Instruction *)tm;
  tm_local = (TypeManager *)this;
  xwidth = GetGlslInsts(this);
  minwidth = Pass::TakeNextId(&this->super_Pass);
  pIVar4 = x_local;
  uVar1 = Instruction::type_id(min_local);
  pTVar3 = analysis::TypeManager::GetType((TypeManager *)pIVar4,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[9])();
  maxwidth = analysis::Integer::width((Integer *)CONCAT44(extraout_var,iVar2));
  pIVar4 = x_local;
  uVar1 = Instruction::type_id(max_local);
  pTVar3 = analysis::TypeManager::GetType((TypeManager *)pIVar4,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[9])();
  local_48 = analysis::Integer::width((Integer *)CONCAT44(extraout_var_00,iVar2));
  pIVar4 = x_local;
  uVar1 = Instruction::type_id(where_local);
  pTVar3 = analysis::TypeManager::GetType((TypeManager *)pIVar4,uVar1);
  iVar2 = (*pTVar3->_vptr_Type[9])();
  clamp_inst._4_4_ = analysis::Integer::width((Integer *)CONCAT44(extraout_var_01,iVar2));
  pIVar4 = _clamp_id;
  if (maxwidth != local_48) {
    __assert_fail("xwidth == minwidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                  ,0x287,
                  "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
                 );
  }
  if (maxwidth == clamp_inst._4_4_) {
    type_id = Instruction::type_id(min_local);
    uVar1 = minwidth;
    local_1ac = xwidth;
    local_1a8 = &local_1ac;
    local_1a0 = 1;
    init_list_03._M_len = 1;
    init_list_03._M_array = local_1a8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_198,init_list_03);
    Operand::Operand(&local_170,SPV_OPERAND_TYPE_ID,&local_198);
    local_1ec = 0x2d;
    local_1e8 = &local_1ec;
    local_1e0 = 1;
    init_list_02._M_len = 1;
    init_list_02._M_array = local_1e8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1d8,init_list_02);
    Operand::Operand(&OStack_140,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_1d8);
    local_22c = Instruction::result_id(min_local);
    local_228 = &local_22c;
    local_220 = 1;
    init_list_01._M_len = 1;
    init_list_01._M_array = local_228;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_218,init_list_01);
    Operand::Operand(&OStack_110,SPV_OPERAND_TYPE_ID,&local_218);
    local_26c = Instruction::result_id(max_local);
    local_268 = &local_26c;
    local_260 = 1;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_268;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_258,init_list_00);
    Operand::Operand(&OStack_e0,SPV_OPERAND_TYPE_ID,&local_258);
    local_2ac = Instruction::result_id(where_local);
    local_2a8 = &local_2ac;
    local_2a0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_2a8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_298,init_list);
    Operand::Operand(&OStack_b0,SPV_OPERAND_TYPE_ID,&local_298);
    local_80 = &local_170;
    local_78 = (_func_int **)0x5;
    std::allocator<spvtools::opt::Operand>::allocator(&local_2ad);
    __l._M_len = (size_type)local_78;
    __l._M_array = local_80;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_70,__l,&local_2ad);
    pIVar4 = InsertInst(this,pIVar4,OpExtInst,type_id,uVar1,&local_70);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_70)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator(&local_2ad);
    local_2d8 = (Operand *)&local_80;
    do {
      local_2d8 = local_2d8 + -1;
      Operand::~Operand(local_2d8);
    } while (local_2d8 != &local_170);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_298);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_258);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_218);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1d8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_198);
    return pIVar4;
  }
  __assert_fail("xwidth == maxwidth",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/graphics_robust_access_pass.cpp"
                ,0x288,
                "Instruction *spvtools::opt::GraphicsRobustAccessPass::MakeSClampInst(const analysis::TypeManager &, Instruction *, Instruction *, Instruction *, Instruction *)"
               );
}

Assistant:

Instruction* GraphicsRobustAccessPass::MakeSClampInst(
    const analysis::TypeManager& tm, Instruction* x, Instruction* min,
    Instruction* max, Instruction* where) {
  // Get IDs of instructions we'll be referencing. Evaluate them before calling
  // the function so we force a deterministic ordering in case both of them need
  // to take a new ID.
  const uint32_t glsl_insts_id = GetGlslInsts();
  uint32_t clamp_id = TakeNextId();
  const auto xwidth = tm.GetType(x->type_id())->AsInteger()->width();
  const auto minwidth = tm.GetType(min->type_id())->AsInteger()->width();
  const auto maxwidth = tm.GetType(max->type_id())->AsInteger()->width();
  assert(xwidth == minwidth);
  assert(xwidth == maxwidth);
  (void)xwidth;
  (void)minwidth;
  (void)maxwidth;
  auto* clamp_inst = InsertInst(
      where, spv::Op::OpExtInst, x->type_id(), clamp_id,
      {
          {SPV_OPERAND_TYPE_ID, {glsl_insts_id}},
          {SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER, {GLSLstd450SClamp}},
          {SPV_OPERAND_TYPE_ID, {x->result_id()}},
          {SPV_OPERAND_TYPE_ID, {min->result_id()}},
          {SPV_OPERAND_TYPE_ID, {max->result_id()}},
      });
  return clamp_inst;
}